

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O2

int ddGroupSiftingAux(DdManager *table,int x,int xLow,int xHigh,DD_CHKFP checkFunction,int lazyFlag)

{
  DdNode *pDVar1;
  uint uVar2;
  uint uVar3;
  uint size;
  int iVar4;
  int iVar5;
  DdSubtable *pDVar6;
  DdNode *pDVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  DdNode *local_38;
  
  size = table->keys - table->isolated;
  local_38 = (DdNode *)0x0;
  pDVar6 = table->subtables;
  uVar8 = x;
  originalSize = size;
  if (pDVar6[x].next == x) {
    while (uVar9 = x, xLow < (int)uVar8) {
      iVar5 = uVar8 - 1;
      iVar4 = (*checkFunction)(table,iVar5,uVar8);
      if (iVar4 == 0) break;
      pDVar6 = table->subtables;
      uVar9 = pDVar6[iVar5].next;
      pDVar6[iVar5].next = uVar8;
      pDVar6[x].next = uVar9;
      uVar8 = uVar9;
    }
    do {
      if (xHigh <= (int)uVar9) goto LAB_0073f2cc;
      uVar8 = uVar9 + 1;
      iVar5 = (*checkFunction)(table,uVar9,uVar8);
      pDVar6 = table->subtables;
      uVar3 = uVar8;
      if (iVar5 == 0) break;
      do {
        uVar2 = uVar3;
        uVar3 = pDVar6[(int)uVar2].next;
      } while (uVar2 < pDVar6[(int)uVar2].next);
      pDVar6[(int)uVar2].next = pDVar6[(int)uVar9].next;
      pDVar6[(int)uVar9].next = uVar8;
      uVar9 = uVar2;
    } while( true );
  }
LAB_0073f2d3:
  do {
    uVar8 = x;
    x = pDVar6[(int)uVar8].next;
  } while (uVar8 < pDVar6[(int)uVar8].next);
  if (uVar8 == xLow) {
    if (xLow == xHigh) {
      return 1;
    }
LAB_0073f415:
    iVar5 = ddGroupSiftingDown(table,xLow,xHigh,checkFunction,(Move **)&local_38);
    if (iVar5 == 0) goto LAB_0073f484;
    iVar5 = 0;
  }
  else {
    iVar5 = cuddNextHigh(table,uVar8);
    if (xHigh < iVar5) {
      uVar9 = table->subtables[(int)uVar8].next;
    }
    else {
      if ((int)(uVar8 - xLow) <= (int)(xHigh - uVar8)) {
        uVar8 = table->subtables[(int)uVar8].next;
        iVar5 = ddGroupSiftingUp(table,uVar8,xLow,checkFunction,(Move **)&local_38);
        if (iVar5 == 0) goto LAB_0073f484;
        if (local_38 != (DdNode *)0x0) {
          uVar8 = local_38->index;
        }
        do {
          xLow = uVar8;
          uVar8 = table->subtables[xLow].next;
        } while ((uint)xLow < uVar8);
        goto LAB_0073f415;
      }
      iVar5 = ddGroupSiftingDown(table,uVar8,xHigh,checkFunction,(Move **)&local_38);
      if (iVar5 == 0) goto LAB_0073f484;
      if (local_38 != (DdNode *)0x0) {
        uVar8 = local_38->ref;
      }
      do {
        uVar9 = table->subtables[(int)uVar8].next;
        bVar10 = uVar8 < uVar9;
        uVar8 = uVar9;
      } while (bVar10);
    }
    iVar5 = ddGroupSiftingUp(table,uVar9,xLow,checkFunction,(Move **)&local_38);
    if (iVar5 == 0) goto LAB_0073f484;
    iVar5 = 1;
  }
  pDVar7 = local_38;
  iVar5 = ddGroupSiftingBackward(table,(Move *)local_38,size,iVar5,lazyFlag);
  local_38 = pDVar7;
  if (iVar5 != 0) {
    while (pDVar7 != (DdNode *)0x0) {
      pDVar1 = (pDVar7->type).kids.T;
      pDVar7->ref = 0;
      pDVar7->next = table->nextFree;
      table->nextFree = pDVar7;
      pDVar7 = pDVar1;
    }
    return 1;
  }
LAB_0073f484:
  while (local_38 != (DdNode *)0x0) {
    pDVar7 = (local_38->type).kids.T;
    local_38->ref = 0;
    local_38->next = table->nextFree;
    table->nextFree = local_38;
    local_38 = pDVar7;
  }
  return 0;
LAB_0073f2cc:
  pDVar6 = table->subtables;
  goto LAB_0073f2d3;
}

Assistant:

static int
ddGroupSiftingAux(
  DdManager * table,
  int  x,
  int  xLow,
  int  xHigh,
  DD_CHKFP checkFunction,
  int lazyFlag)
{
    Move *move;
    Move *moves;        /* list of moves */
    int  initialSize;
    int  result;
    int  y;
    int  topbot;

#ifdef DD_DEBUG
    if (pr > 0) (void) fprintf(table->out,
                               "ddGroupSiftingAux from %d to %d\n",xLow,xHigh);
    assert((unsigned) x >= table->subtables[x].next); /* x is bottom of group */
#endif

    initialSize = table->keys - table->isolated;
    moves = NULL;

    originalSize = initialSize;         /* for lazy sifting */

    /* If we have a singleton, we check for aggregation in both
    ** directions before we sift.
    */
    if ((unsigned) x == table->subtables[x].next) {
        /* Will go down first, unless x == xHigh:
        ** Look for aggregation above x.
        */
        for (y = x; y > xLow; y--) {
            if (!checkFunction(table,y-1,y))
                break;
            topbot = table->subtables[y-1].next; /* find top of y-1's group */
            table->subtables[y-1].next = y;
            table->subtables[x].next = topbot; /* x is bottom of group so its */
                                               /* next is top of y-1's group */
            y = topbot + 1; /* add 1 for y--; new y is top of group */
        }
        /* Will go up first unless x == xlow:
        ** Look for aggregation below x.
        */
        for (y = x; y < xHigh; y++) {
            if (!checkFunction(table,y,y+1))
                break;
            /* find bottom of y+1's group */
            topbot = y + 1;
            while ((unsigned) topbot < table->subtables[topbot].next) {
                topbot = table->subtables[topbot].next;
            }
            table->subtables[topbot].next = table->subtables[y].next;
            table->subtables[y].next = y + 1;
            y = topbot - 1; /* subtract 1 for y++; new y is bottom of group */
        }
    }

    /* Now x may be in the middle of a group.
    ** Find bottom of x's group.
    */
    while ((unsigned) x < table->subtables[x].next)
        x = table->subtables[x].next;

    if (x == xLow) { /* Sift down */
#ifdef DD_DEBUG
        /* x must be a singleton */
        assert((unsigned) x == table->subtables[x].next);
#endif
        if (x == xHigh) return(1);      /* just one variable */

        if (!ddGroupSiftingDown(table,x,xHigh,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;
        /* at this point x == xHigh, unless early term */

        /* move backward and stop at best position */
        result = ddGroupSiftingBackward(table,moves,initialSize,
                                        DD_SIFT_DOWN,lazyFlag);
#ifdef DD_DEBUG
        assert(table->keys - table->isolated <= (unsigned) initialSize);
#endif
        if (!result) goto ddGroupSiftingAuxOutOfMem;

    } else if (cuddNextHigh(table,x) > xHigh) { /* Sift up */
#ifdef DD_DEBUG
        /* x is bottom of group */
        assert((unsigned) x >= table->subtables[x].next);
#endif
        /* Find top of x's group */
        x = table->subtables[x].next;

        if (!ddGroupSiftingUp(table,x,xLow,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;
        /* at this point x == xLow, unless early term */

        /* move backward and stop at best position */
        result = ddGroupSiftingBackward(table,moves,initialSize,
                                        DD_SIFT_UP,lazyFlag);
#ifdef DD_DEBUG
        assert(table->keys - table->isolated <= (unsigned) initialSize);
#endif
        if (!result) goto ddGroupSiftingAuxOutOfMem;

    } else if (x - xLow > xHigh - x) { /* must go down first: shorter */
        if (!ddGroupSiftingDown(table,x,xHigh,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;
        /* at this point x == xHigh, unless early term */

        /* Find top of group */
        if (moves) {
            x = moves->y;
        }
        while ((unsigned) x < table->subtables[x].next)
            x = table->subtables[x].next;
        x = table->subtables[x].next;
#ifdef DD_DEBUG
        /* x should be the top of a group */
        assert((unsigned) x <= table->subtables[x].next);
#endif

        if (!ddGroupSiftingUp(table,x,xLow,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;

        /* move backward and stop at best position */
        result = ddGroupSiftingBackward(table,moves,initialSize,
                                        DD_SIFT_UP,lazyFlag);
#ifdef DD_DEBUG
        assert(table->keys - table->isolated <= (unsigned) initialSize);
#endif
        if (!result) goto ddGroupSiftingAuxOutOfMem;

    } else { /* moving up first: shorter */
        /* Find top of x's group */
        x = table->subtables[x].next;

        if (!ddGroupSiftingUp(table,x,xLow,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;
        /* at this point x == xHigh, unless early term */

        if (moves) {
            x = moves->x;
        }
        while ((unsigned) x < table->subtables[x].next)
            x = table->subtables[x].next;
#ifdef DD_DEBUG
        /* x is bottom of a group */
        assert((unsigned) x >= table->subtables[x].next);
#endif

        if (!ddGroupSiftingDown(table,x,xHigh,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;

        /* move backward and stop at best position */
        result = ddGroupSiftingBackward(table,moves,initialSize,
                                        DD_SIFT_DOWN,lazyFlag);
#ifdef DD_DEBUG
        assert(table->keys - table->isolated <= (unsigned) initialSize);
#endif
        if (!result) goto ddGroupSiftingAuxOutOfMem;
    }

    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }

    return(1);

ddGroupSiftingAuxOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }

    return(0);

}